

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int send_client_hello(ptls_t *tls,ptls_message_emitter_t *emitter,
                     ptls_handshake_properties_t *properties,ptls_iovec_t *cookie)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ptls_key_schedule_t *ppVar4;
  ptls_context_t *ppVar5;
  size_t sVar6;
  _func_void_void_ptr_size_t *p_Var7;
  ptls_hpke_kem_t *ppVar8;
  ptls_hpke_cipher_suite_t *ppVar9;
  size_t *psVar10;
  ptls_cipher_suite_t *ppVar11;
  ptls_buffer_t *sendbuf;
  st_ptls_aead_context_t *psVar12;
  ptls_iovec_t info;
  ptls_iovec_t psk_secret;
  ptls_iovec_t psk_secret_00;
  ptls_iovec_t psk_secret_01;
  ptls_iovec_t psk_identity;
  ptls_iovec_t psk_identity_00;
  ptls_iovec_t psk_identity_01;
  undefined8 uVar13;
  int iVar14;
  ptls_early_data_acceptance_t pVar15;
  uint32_t obfuscated_ticket_age;
  ptls_hpke_cipher_suite_t **pppVar16;
  ptls_aead_context_t *ppVar17;
  uint8_t *puVar18;
  size_t sVar19;
  ptls_key_schedule_t *sched;
  char *pcVar20;
  uint is_second_flight;
  ptls_hpke_kem_t **pppVar21;
  ptls_key_exchange_algorithm_t **pppVar22;
  ptls_cipher_suite_t **pppVar23;
  char *__s;
  long lVar24;
  ulong uVar25;
  ushort *puVar26;
  size_t sVar27;
  size_t sVar28;
  ptls_key_exchange_algorithm_t *ppVar29;
  uint8_t *puVar30;
  ptls_iovec_t config_list;
  ptls_iovec_t ikm;
  ushort *local_268;
  size_t sStack_260;
  ptls_iovec_t local_258;
  char *local_248;
  uint8_t *local_238;
  ptls_key_schedule_t *local_230;
  uint32_t max_early_data_size;
  uint32_t age_add;
  ptls_buffer_t local_220;
  ushort *local_200;
  ptls_iovec_t *local_1f8;
  st_ptls_ech_t *local_1f0;
  size_t local_1e8;
  uint8_t *local_1e0;
  uint32_t lifetime;
  size_t sStack_1d0;
  ptls_buffer_t infobuf;
  st_decoded_ech_config_t decoded;
  uint8_t binder_key [64];
  
  local_258.base = (uint8_t *)0x0;
  local_258.len = 0;
  local_268 = (ushort *)0x0;
  sStack_260 = 0;
  local_248 = (char *)0x0;
  ppVar4 = tls->key_schedule;
  local_220.base = "";
  local_220.is_allocated = '\0';
  local_220.align_bits = '\0';
  local_220.capacity = 0;
  local_220.off = 0;
  if ((tls->server_name == (char *)0x0) ||
     (iVar14 = ptls_server_name_is_ipaddr(tls->server_name), iVar14 != 0)) {
    __s = (char *)0x0;
  }
  else {
    __s = tls->server_name;
  }
  if ((__s != (char *)0x0 && properties != (ptls_handshake_properties_t *)0x0) &&
      ppVar4 == (ptls_key_schedule_t *)0x0) {
    ppVar5 = tls->ctx;
    pppVar16 = (ppVar5->ech).client.ciphers;
    if (pppVar16 != (ptls_hpke_cipher_suite_t **)0x0) {
      sVar6 = (properties->field_0).client.ech.configs.len;
      if (sVar6 == 0) {
        p_Var7 = ppVar5->random_bytes;
        pppVar21 = (ppVar5->ech).client.kems;
        do {
          ppVar8 = *pppVar21;
          if (ppVar8 == (ptls_hpke_kem_t *)0x0) goto LAB_0010f6d4;
          pppVar21 = pppVar21 + 1;
        } while (ppVar8->id != 0x20);
        (tls->ech).kem = ppVar8;
LAB_0010f6d4:
        do {
          ppVar9 = *pppVar16;
          if (ppVar9 == (ptls_hpke_cipher_suite_t *)0x0) goto LAB_0010f6e5;
          if (((ppVar9->id).kdf == 1) && ((ppVar9->id).aead == 1)) {
            (tls->ech).cipher = ppVar9;
            goto LAB_0010f6e5;
          }
          pppVar16 = pppVar16 + 1;
        } while( true );
      }
      config_list.len = sVar6;
      config_list.base = (properties->field_0).client.ech.configs.base;
      client_decode_ech_config_list(ppVar5,&decoded,config_list);
      if (decoded.cipher != (ptls_hpke_cipher_suite_t *)0x0 && decoded.kem != (ptls_hpke_kem_t *)0x0
         ) {
        p_Var7 = tls->ctx->random_bytes;
        infobuf.base = binder_key;
        infobuf.off = 0;
        infobuf.capacity = 0x100;
        infobuf.is_allocated = '\0';
        infobuf.align_bits = '\0';
        iVar14 = ptls_buffer__do_pushv(&infobuf,"tls ech",8);
        if ((iVar14 == 0) &&
           (iVar14 = ptls_buffer__do_pushv(&infobuf,decoded.bytes.base,decoded.bytes.len),
           iVar14 == 0)) {
          _lifetime = infobuf.base;
          sStack_1d0 = infobuf.off;
          info.len = infobuf.off;
          info.base = infobuf.base;
          iVar14 = ptls_hpke_setup_base_s
                             (decoded.kem,decoded.cipher,&(tls->ech).client.enc,&(tls->ech).aead,
                              decoded.public_key,info);
          if (iVar14 == 0) {
            (tls->ech).config_id = decoded.id;
            (tls->ech).kem = decoded.kem;
            (tls->ech).cipher = decoded.cipher;
            (*p_Var7)((tls->ech).inner_client_random,0x20);
            (tls->ech).client.max_name_length = decoded.max_name_length;
            pcVar20 = duplicate_as_str(decoded.public_name.base,decoded.public_name.len);
            (tls->ech).client.public_name = pcVar20;
            if (pcVar20 != (char *)0x0) goto LAB_0010f7a4;
            iVar14 = 0x201;
          }
        }
        clear_ech(&tls->ech,0);
        goto LAB_0010fd4e;
      }
    }
  }
LAB_0010f7a4:
  ppVar5 = tls->ctx;
  obfuscated_ticket_age = 0;
  if ((ppVar5->pre_shared_key).identity.base != (uint8_t *)0x0) {
    if (ppVar4 == (ptls_key_schedule_t *)0x0) {
      bVar1 = (tls->field_19).server.pending_traffic_secret[0x38];
      (tls->field_19).server.pending_traffic_secret[0x38] = bVar1 | 1;
      pppVar23 = ppVar5->cipher_suites;
      do {
        ppVar11 = *pppVar23;
        if (ppVar11 == (ptls_cipher_suite_t *)0x0) {
          if (tls->cipher_suite == (ptls_cipher_suite_t *)0x0) {
            __assert_fail("tls->cipher_suite != NULL && \"no compatible cipher-suite provided that matches psk.hash\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                          ,0x954,
                          "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                         );
          }
          goto LAB_0010fd92;
        }
        pppVar23 = pppVar23 + 1;
      } while (ppVar11->hash != (ppVar5->pre_shared_key).hash);
      tls->cipher_suite = ppVar11;
LAB_0010fd92:
      if ((properties != (ptls_handshake_properties_t *)0x0) &&
         ((properties->field_0).client.max_early_data_size != (size_t *)0x0)) {
        (tls->field_19).server.pending_traffic_secret[0x38] = bVar1 | 3;
        *(properties->field_0).client.max_early_data_size = 0xffffffffffffffff;
      }
    }
    else if ((tls->cipher_suite == (ptls_cipher_suite_t *)0x0) ||
            (tls->cipher_suite->hash != (ppVar5->pre_shared_key).hash)) {
      __assert_fail("tls->cipher_suite != NULL && tls->cipher_suite->hash == tls->ctx->pre_shared_key.hash"
                    ,"/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                    ,0x95a,
                    "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                   );
    }
    local_268 = (ushort *)(ppVar5->pre_shared_key).secret.base;
    sStack_260 = (ppVar5->pre_shared_key).secret.len;
    local_258.base = (ppVar5->pre_shared_key).identity.base;
    local_258.len = (ppVar5->pre_shared_key).identity.len;
    local_248 = "ext binder";
  }
  if (local_268 == (ushort *)0x0 && properties != (ptls_handshake_properties_t *)0x0) {
    puVar18 = (properties->field_0).client.session_ticket.base;
    if ((puVar18 != (uint8_t *)0x0) &&
       (ppVar5->key_exchanges != (ptls_key_exchange_algorithm_t **)0x0)) {
      puVar30 = puVar18 + (properties->field_0).client.session_ticket.len;
      decoded._0_8_ = puVar18;
      iVar14 = ptls_decode64((uint64_t *)&infobuf,(uint8_t **)&decoded,puVar30);
      if ((iVar14 == 0) &&
         (((1 < (long)puVar30 - decoded._0_8_ && (1 < ((long)puVar30 - decoded._0_8_) + -2)) &&
          (2 < (ulong)((long)puVar30 - (decoded._0_8_ + 4)))))) {
        uVar2 = *(ushort *)decoded._0_8_;
        uVar3 = *(ushort *)(decoded._0_8_ + 2);
        lVar24 = 0;
        uVar25 = 0;
        do {
          uVar25 = (ulong)*(byte *)(decoded._0_8_ + 4 + lVar24) | uVar25 << 8;
          lVar24 = lVar24 + 1;
        } while (lVar24 != 3);
        puVar18 = (uint8_t *)(decoded._0_8_ + 7);
        if (uVar25 <= (ulong)((long)puVar30 - (long)puVar18)) {
          local_268 = (ushort *)(puVar18 + uVar25);
          iVar14 = decode_new_session_ticket
                             (tls,&lifetime,&age_add,(ptls_iovec_t *)binder_key,&local_258,
                              &max_early_data_size,puVar18,(uint8_t *)local_268);
          if ((1 < (ulong)((long)puVar30 - (long)local_268)) && (iVar14 == 0)) {
            sStack_260 = (size_t)(ushort)(*local_268 << 8 | *local_268 >> 8);
            local_268 = local_268 + 1;
            if ((sStack_260 <= (ulong)((long)puVar30 - (long)local_268)) &&
               ((uint8_t *)(sStack_260 + (long)local_268) == puVar30)) {
              ppVar5 = tls->ctx;
              pppVar22 = ppVar5->key_exchanges;
              do {
                ppVar29 = *pppVar22;
                if (ppVar29 == (ptls_key_exchange_algorithm_t *)0x0) goto LAB_0010f8d7;
                pppVar22 = pppVar22 + 1;
              } while (ppVar29->id != (uint16_t)(uVar2 << 8 | uVar2 >> 8));
              pppVar23 = ppVar5->cipher_suites;
              do {
                ppVar11 = *pppVar23;
                if (ppVar11 == (ptls_cipher_suite_t *)0x0) goto LAB_0010f8d7;
                pppVar23 = pppVar23 + 1;
              } while (ppVar11->id != (uint16_t)(uVar3 << 8 | uVar3 >> 8));
              puVar18 = (uint8_t *)(*ppVar5->get_time->cb)(ppVar5->get_time);
              if ((infobuf.base <= puVar18) &&
                 ((ulong)((long)puVar18 - (long)infobuf.base) < 0x240c8400)) {
                local_248 = "res binder";
                bVar1 = (tls->field_19).server.pending_traffic_secret[0x38];
                obfuscated_ticket_age = (int)((long)puVar18 - (long)infobuf.base) + age_add;
                (tls->field_19).server.pending_traffic_secret[0x38] = bVar1 | 1;
                if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
                  tls->key_share = ppVar29;
                }
                tls->cipher_suite = ppVar11;
                if ((max_early_data_size != 0 && ppVar4 == (ptls_key_schedule_t *)0x0) &&
                   ((properties->field_0).client.max_early_data_size != (size_t *)0x0)) {
                  (tls->field_19).server.pending_traffic_secret[0x38] = bVar1 | 3;
                  *(properties->field_0).client.max_early_data_size = (ulong)max_early_data_size;
                }
                goto LAB_0010f8e7;
              }
            }
          }
        }
      }
LAB_0010f8d7:
      local_268 = (ushort *)0x0;
      sStack_260 = 0;
      obfuscated_ticket_age = 0;
      goto LAB_0010f8e7;
    }
    puVar26 = (ushort *)0x0;
    obfuscated_ticket_age = 0;
LAB_0010f8f3:
    pVar15 = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
    if (((tls->field_19).server.pending_traffic_secret[0x38] & 2) == 0) {
      pVar15 = PTLS_EARLY_DATA_REJECTED;
      psVar10 = (properties->field_0).client.max_early_data_size;
      if (psVar10 != (size_t *)0x0) {
        *psVar10 = 0;
      }
    }
    (properties->field_0).client.early_data_acceptance = pVar15;
  }
  else {
LAB_0010f8e7:
    puVar26 = local_268;
    if (properties != (ptls_handshake_properties_t *)0x0) goto LAB_0010f8f3;
  }
  ppVar29 = tls->key_share;
  if (ppVar29 == (ptls_key_exchange_algorithm_t *)0x0) {
    pppVar22 = tls->ctx->key_exchanges;
    if ((pppVar22 == (ptls_key_exchange_algorithm_t **)0x0) ||
       ((properties != (ptls_handshake_properties_t *)0x0 &&
        (((properties->field_0).server.selected_psk_binder.base[0x2c] & 1) != 0)))) {
      ppVar29 = (st_ptls_key_exchange_algorithm_t *)0x0;
    }
    else {
      ppVar29 = *pppVar22;
      tls->key_share = ppVar29;
    }
  }
  if ((tls->field_19).client.key_share_ctx != (ptls_key_exchange_context_t *)0x0) {
    __assert_fail("tls->client.key_share_ctx == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x98a,
                  "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                 );
  }
  if ((ppVar29 != (st_ptls_key_exchange_algorithm_t *)0x0) &&
     (iVar14 = (*ppVar29->create)(ppVar29,&(tls->field_19).client.key_share_ctx), iVar14 != 0))
  goto LAB_0010fd4e;
  if (ppVar4 == (ptls_key_schedule_t *)0x0) {
    sched = key_schedule_new(tls->cipher_suite,tls->ctx->cipher_suites,
                             (uint)((tls->ech).aead != (ptls_aead_context_t *)0x0));
    tls->key_schedule = sched;
    if (sched != (ptls_key_schedule_t *)0x0) {
      ikm.len = sStack_260;
      ikm.base = (uint8_t *)puVar26;
      iVar14 = key_schedule_extract(sched,ikm);
      if (iVar14 != 0) goto LAB_0010fd4e;
      goto LAB_0010f9b0;
    }
LAB_0011028c:
    iVar14 = 0x201;
  }
  else {
LAB_0010f9b0:
    iVar14 = (*emitter->begin_message)(emitter);
    if (iVar14 != 0) goto LAB_0010fd4e;
    local_1f8 = (ptls_iovec_t *)&tls->field_19;
    sVar6 = emitter->buf->off;
    local_1f0 = &tls->ech;
    local_1e0 = (tls->ech).inner_client_random;
    puVar18 = tls->client_random;
    puVar30 = local_1e0;
    if ((tls->ech).aead == (ptls_aead_context_t *)0x0) {
      puVar30 = puVar18;
    }
    psk_secret.len = sStack_260;
    psk_secret.base = (uint8_t *)local_268;
    psk_identity.len = local_258.len;
    psk_identity.base = local_258.base;
    is_second_flight = (uint)(ppVar4 != (ptls_key_schedule_t *)0x0);
    local_230 = ppVar4;
    iVar14 = encode_client_hello(tls->ctx,emitter->buf,ENCODE_CH_MODE_INNER,is_second_flight,
                                 properties,puVar30,(tls->field_19).client.key_share_ctx,__s,
                                 ((anon_struct_120_6_b99d20b8_for_client *)local_1f8)->
                                 legacy_session_id,local_1f0,(size_t *)0x0,
                                 (tls->ech).client.first_ech,psk_secret,psk_identity,
                                 obfuscated_ticket_age,
                                 (tls->key_schedule->hashes[0].algo)->digest_size,cookie,
                                 *(uint *)((long)&tls->field_19 + 0x38) >> 1 & 1);
    if (iVar14 != 0) goto LAB_0010fd4e;
    local_200 = local_268;
    sVar27 = sVar6;
    local_238 = puVar18;
    if (local_268 != (ushort *)0x0) {
      sVar27 = emitter->buf->off;
      local_1e8 = (tls->key_schedule->hashes[0].algo)->digest_size;
      iVar14 = derive_secret_with_empty_digest(tls->key_schedule,binder_key,local_248);
      if (iVar14 != 0) goto LAB_0010fd4e;
      lVar24 = sVar27 - local_1e8;
      sVar27 = lVar24 - 3;
      ptls__key_schedule_update_hash(tls->key_schedule,emitter->buf->base + sVar6,sVar27 - sVar6,0);
      iVar14 = calc_verify_data(emitter->buf->base + lVar24,tls->key_schedule,binder_key);
      if (iVar14 != 0) goto LAB_0010fd4e;
    }
    ptls__key_schedule_update_hash
              (tls->key_schedule,emitter->buf->base + sVar27,emitter->buf->off - sVar27,0);
    if ((tls->ech).aead != (ptls_aead_context_t *)0x0) {
      psk_secret_00.len = sStack_260;
      psk_secret_00.base = (uint8_t *)local_268;
      psk_identity_00.len = local_258.len;
      psk_identity_00.base = local_258.base;
      iVar14 = encode_client_hello(tls->ctx,&local_220,ENCODE_CH_MODE_ENCODED_INNER,is_second_flight
                                   ,properties,local_1e0,(tls->field_19).client.key_share_ctx,__s,
                                   *local_1f8,local_1f0,(size_t *)0x0,(ptls_iovec_t)ZEXT816(0),
                                   psk_secret_00,psk_identity_00,obfuscated_ticket_age,
                                   (tls->key_schedule->hashes[0].algo)->digest_size,cookie,
                                   *(uint *)((long)&tls->field_19 + 0x38) >> 1 & 1);
      if (iVar14 != 0) goto LAB_0010fd4e;
      if (local_200 != (ushort *)0x0) {
        sVar28 = (tls->key_schedule->hashes[0].algo)->digest_size;
        memcpy(local_220.base + (local_220.off - sVar28),
               emitter->buf->base + (emitter->buf->off - sVar28),sVar28);
      }
      if (__s == (char *)0x0) {
        sVar28 = (ulong)(tls->ech).client.max_name_length + 9;
      }
      else {
        sVar19 = strlen(__s);
        sVar28 = (size_t)(tls->ech).client.max_name_length;
        if (sVar28 < sVar19) {
          sVar28 = sVar19;
        }
      }
      sVar28 = (sVar28 + local_220.off + 0x1b & 0xffffffffffffffe0) - (local_220.off - 4);
      if (sVar28 != 0) {
        iVar14 = ptls_buffer_reserve(&local_220,sVar28);
        if (iVar14 != 0) goto LAB_0010fd4e;
        memset(local_220.base + local_220.off,0,sVar28);
        local_220.off = local_220.off + sVar28;
      }
      sendbuf = emitter->buf;
      sendbuf->off = sVar6;
      lVar24 = (local_220.off - 4) + ((tls->ech).aead)->algo->tag_size;
      psk_secret_01.len = sStack_260;
      psk_secret_01.base = (uint8_t *)local_268;
      psk_identity_01.len = local_258.len;
      psk_identity_01.base = local_258.base;
      decoded._0_8_ = lVar24;
      iVar14 = encode_client_hello(tls->ctx,sendbuf,ENCODE_CH_MODE_OUTER,is_second_flight,properties
                                   ,local_238,(tls->field_19).client.key_share_ctx,
                                   (tls->ech).client.public_name,*local_1f8,local_1f0,
                                   (size_t *)&decoded,(ptls_iovec_t)ZEXT816(0),psk_secret_01,
                                   psk_identity_01,obfuscated_ticket_age,
                                   (tls->key_schedule->hashes[0].algo)->digest_size,cookie,
                                   *(uint *)((long)&tls->field_19 + 0x38) >> 1 & 1);
      uVar13 = decoded._0_8_;
      ppVar4 = local_230;
      if (iVar14 != 0) goto LAB_0010fd4e;
      psVar12 = (tls->ech).aead;
      puVar18 = emitter->buf->base;
      (*psVar12->do_encrypt)
                (psVar12,puVar18 + decoded._0_8_,local_220.base + 4,local_220.off - 4,
                 (ulong)(local_230 != (ptls_key_schedule_t *)0x0),puVar18 + sVar6 + 4,
                 (emitter->buf->off - sVar6) - 4,(ptls_aead_supplementary_encryption_t *)0x0);
      if (ppVar4 == (ptls_key_schedule_t *)0x0) {
        sVar27 = (tls->ech).client.enc.len;
        sVar28 = sVar27 + 10 + lVar24;
        puVar18 = (uint8_t *)malloc(sVar28);
        (tls->ech).client.first_ech.base = puVar18;
        if (puVar18 == (uint8_t *)0x0) goto LAB_0011028c;
        memcpy(puVar18,emitter->buf->base + (uVar13 - sVar27) + -10,sVar28);
        (tls->ech).client.first_ech.len = sVar28;
        *(byte *)&tls->ech =
             *(byte *)&tls->ech | ((properties->field_0).client.ech.configs.len == 0) + 1U;
      }
      ptls__key_schedule_update_hash
                (tls->key_schedule,emitter->buf->base + sVar6,emitter->buf->off - sVar6,1);
    }
    iVar14 = (*emitter->commit_message)(emitter);
    if (iVar14 == 0) {
      if (((tls->field_19).server.pending_traffic_secret[0x38] & 2) != 0) {
        if (local_230 != (ptls_key_schedule_t *)0x0) {
          __assert_fail("!is_second_flight",
                        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                        ,0x9fb,
                        "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                       );
        }
        iVar14 = setup_traffic_protection(tls,1,"c e traffic",1,0,0);
        if ((iVar14 != 0) || (iVar14 = push_change_cipher_spec(tls,emitter), iVar14 != 0))
        goto LAB_0010fd4e;
      }
      if ((local_230 != (ptls_key_schedule_t *)0x0 || local_200 == (ushort *)0x0) ||
         (iVar14 = derive_exporter_secret(tls,1), iVar14 == 0)) {
        tls->state = PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO - (cookie == (ptls_iovec_t *)0x0);
        iVar14 = 0x202;
      }
    }
  }
LAB_0010fd4e:
  ptls_buffer_dispose(&local_220);
  (*ptls_clear_memory)(binder_key,0x40);
  return iVar14;
LAB_0010f6e5:
  if (((tls->ech).kem != (ptls_hpke_kem_t *)0x0) &&
     ((tls->ech).cipher != (ptls_hpke_cipher_suite_t *)0x0)) {
    (*p_Var7)(binder_key,0x20);
    ppVar17 = ptls_aead_new_direct(((tls->ech).cipher)->aead,1,binder_key,binder_key + 0x10);
    (tls->ech).aead = ppVar17;
    puVar18 = (uint8_t *)malloc(0x20);
    (tls->ech).client.enc.base = puVar18;
    if (puVar18 != (uint8_t *)0x0) {
      (tls->ech).client.enc.len = 0x20;
      (*p_Var7)(puVar18,0x20);
      (*p_Var7)(&(tls->ech).config_id,1);
      (tls->ech).client.max_name_length = '@';
      sVar28 = strlen(__s);
      pcVar20 = duplicate_as_str(__s,sVar28);
      (tls->ech).client.public_name = pcVar20;
      if (pcVar20 != (char *)0x0) goto LAB_0010f7a4;
    }
  }
  clear_ech(&tls->ech,0);
  goto LAB_0010f7a4;
}

Assistant:

static int send_client_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_handshake_properties_t *properties,
                             ptls_iovec_t *cookie)
{
    struct {
        ptls_iovec_t secret;
        ptls_iovec_t identity;
        const char *label;
    } psk = {{NULL}};
    uint32_t obfuscated_ticket_age = 0;
    const char *sni_name = NULL;
    size_t mess_start, msghash_off;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    ptls_buffer_t encoded_ch_inner;
    int ret, is_second_flight = tls->key_schedule != NULL;

    ptls_buffer_init(&encoded_ch_inner, "", 0);

    if (tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name))
        sni_name = tls->server_name;

    /* try to use ECH (ignore broken ECHConfigList; it is delivered insecurely) */
    if (properties != NULL) {
        if (!is_second_flight && sni_name != NULL && tls->ctx->ech.client.ciphers != NULL) {
            if (properties->client.ech.configs.len != 0) {
                struct st_decoded_ech_config_t decoded;
                client_decode_ech_config_list(tls->ctx, &decoded, properties->client.ech.configs);
                if (decoded.kem != NULL && decoded.cipher != NULL) {
                    if ((ret = client_setup_ech(&tls->ech, &decoded, tls->ctx->random_bytes)) != 0)
                        goto Exit;
                }
            } else {
                /* zero-length config indicates ECH greasing */
                client_setup_ech_grease(&tls->ech, tls->ctx->random_bytes, tls->ctx->ech.client.kems, tls->ctx->ech.client.ciphers,
                                        sni_name);
            }
        }
    }

    /* use external PSK if provided */
    if (tls->ctx->pre_shared_key.identity.base != NULL) {
        if (!is_second_flight) {
            tls->client.offered_psk = 1;
            for (size_t i = 0; tls->ctx->cipher_suites[i] != NULL; ++i) {
                if (tls->ctx->cipher_suites[i]->hash == tls->ctx->pre_shared_key.hash) {
                    tls->cipher_suite = tls->ctx->cipher_suites[i];
                    break;
                }
            }
            assert(tls->cipher_suite != NULL && "no compatible cipher-suite provided that matches psk.hash");
            if (properties != NULL && properties->client.max_early_data_size != NULL) {
                tls->client.using_early_data = 1;
                *properties->client.max_early_data_size = SIZE_MAX;
            }
        } else {
            assert(tls->cipher_suite != NULL && tls->cipher_suite->hash == tls->ctx->pre_shared_key.hash);
        }
        psk.secret = tls->ctx->pre_shared_key.secret;
        psk.identity = tls->ctx->pre_shared_key.identity;
        psk.label = "ext binder";
    }

    /* try to setup resumption-related data, unless external PSK is used */
    if (psk.secret.base == NULL && properties != NULL && properties->client.session_ticket.base != NULL &&
        tls->ctx->key_exchanges != NULL) {
        ptls_key_exchange_algorithm_t *key_share = NULL;
        ptls_cipher_suite_t *cipher_suite = NULL;
        uint32_t max_early_data_size;
        if (decode_stored_session_ticket(tls, &key_share, &cipher_suite, &psk.secret, &obfuscated_ticket_age, &psk.identity,
                                         &max_early_data_size, properties->client.session_ticket.base,
                                         properties->client.session_ticket.base + properties->client.session_ticket.len) == 0) {
            psk.label = "res binder";
            tls->client.offered_psk = 1;
            /* key-share selected by HRR should not be overridden */
            if (tls->key_share == NULL)
                tls->key_share = key_share;
            tls->cipher_suite = cipher_suite;
            if (!is_second_flight && max_early_data_size != 0 && properties->client.max_early_data_size != NULL) {
                tls->client.using_early_data = 1;
                *properties->client.max_early_data_size = max_early_data_size;
            }
        } else {
            psk.secret = ptls_iovec_init(NULL, 0);
        }
    }

    /* send 0-RTT related signals back to the client */
    if (properties != NULL) {
        if (tls->client.using_early_data) {
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
        } else {
            if (properties->client.max_early_data_size != NULL)
                *properties->client.max_early_data_size = 0;
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_REJECTED;
        }
    }

    /* use the default key share if still not undetermined */
    if (tls->key_share == NULL && tls->ctx->key_exchanges != NULL &&
        !(properties != NULL && properties->client.negotiate_before_key_exchange))
        tls->key_share = tls->ctx->key_exchanges[0];

    /* instantiate key share context */
    assert(tls->client.key_share_ctx == NULL);
    if (tls->key_share != NULL) {
        if ((ret = tls->key_share->create(tls->key_share, &tls->client.key_share_ctx)) != 0)
            goto Exit;
    }

    /* initialize key schedule */
    if (!is_second_flight) {
        if ((tls->key_schedule = key_schedule_new(tls->cipher_suite, tls->ctx->cipher_suites, tls->ech.aead != NULL)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        if ((ret = key_schedule_extract(tls->key_schedule, psk.secret)) != 0)
            goto Exit;
    }

    /* start generating CH */
    if ((ret = emitter->begin_message(emitter)) != 0)
        goto Exit;
    mess_start = msghash_off = emitter->buf->off;

    /* generate true (inner) CH */
    if ((ret = encode_client_hello(tls->ctx, emitter->buf, ENCODE_CH_MODE_INNER, is_second_flight, properties,
                                   tls->ech.aead != NULL ? tls->ech.inner_client_random : tls->client_random,
                                   tls->client.key_share_ctx, sni_name, tls->client.legacy_session_id, &tls->ech, NULL,
                                   tls->ech.client.first_ech, psk.secret, psk.identity, obfuscated_ticket_age,
                                   tls->key_schedule->hashes[0].algo->digest_size, cookie, tls->client.using_early_data)) != 0)
        goto Exit;

    /* update the message hash, filling in the PSK binder HMAC if necessary */
    if (psk.secret.base != NULL) {
        size_t psk_binder_off = emitter->buf->off - (3 + tls->key_schedule->hashes[0].algo->digest_size);
        if ((ret = derive_secret_with_empty_digest(tls->key_schedule, binder_key, psk.label)) != 0)
            goto Exit;
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, psk_binder_off - msghash_off, 0);
        msghash_off = psk_binder_off;
        if ((ret = calc_verify_data(emitter->buf->base + psk_binder_off + 3, tls->key_schedule, binder_key)) != 0)
            goto Exit;
    }
    ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, emitter->buf->off - msghash_off, 0);

    /* ECH */
    if (tls->ech.aead != NULL) {
        /* build EncodedCHInner */
        if ((ret = encode_client_hello(tls->ctx, &encoded_ch_inner, ENCODE_CH_MODE_ENCODED_INNER, is_second_flight, properties,
                                       tls->ech.inner_client_random, tls->client.key_share_ctx, sni_name,
                                       tls->client.legacy_session_id, &tls->ech, NULL, ptls_iovec_init(NULL, 0), psk.secret,
                                       psk.identity, obfuscated_ticket_age, tls->key_schedule->hashes[0].algo->digest_size, cookie,
                                       tls->client.using_early_data)) != 0)
            goto Exit;
        if (psk.secret.base != NULL)
            memcpy(encoded_ch_inner.base + encoded_ch_inner.off - tls->key_schedule->hashes[0].algo->digest_size,
                   emitter->buf->base + emitter->buf->off - tls->key_schedule->hashes[0].algo->digest_size,
                   tls->key_schedule->hashes[0].algo->digest_size);
        { /* pad EncodedCHInner (following draft-ietf-tls-esni-15 6.1.3) */
            size_t padding_len;
            if (sni_name != NULL) {
                padding_len = strlen(sni_name);
                if (padding_len < tls->ech.client.max_name_length)
                    padding_len = tls->ech.client.max_name_length;
            } else {
                padding_len = tls->ech.client.max_name_length + 9;
            }
            size_t final_len = encoded_ch_inner.off - PTLS_HANDSHAKE_HEADER_SIZE + padding_len;
            final_len = (final_len + 31) / 32 * 32;
            padding_len = final_len - (encoded_ch_inner.off - PTLS_HANDSHAKE_HEADER_SIZE);
            if (padding_len != 0) {
                if ((ret = ptls_buffer_reserve(&encoded_ch_inner, padding_len)) != 0)
                    goto Exit;
                memset(encoded_ch_inner.base + encoded_ch_inner.off, 0, padding_len);
                encoded_ch_inner.off += padding_len;
            }
        }
        /* flush CHInner, build CHOuterAAD */
        emitter->buf->off = mess_start;
        size_t ech_payload_size = encoded_ch_inner.off - PTLS_HANDSHAKE_HEADER_SIZE + tls->ech.aead->algo->tag_size,
               ech_size_offset = ech_payload_size;
        if ((ret = encode_client_hello(tls->ctx, emitter->buf, ENCODE_CH_MODE_OUTER, is_second_flight, properties,
                                       tls->client_random, tls->client.key_share_ctx, tls->ech.client.public_name,
                                       tls->client.legacy_session_id, &tls->ech, &ech_size_offset, ptls_iovec_init(NULL, 0),
                                       psk.secret, psk.identity, obfuscated_ticket_age,
                                       tls->key_schedule->hashes[0].algo->digest_size, cookie, tls->client.using_early_data)) != 0)
            goto Exit;
        /* overwrite ECH payload */
        ptls_aead_encrypt(tls->ech.aead, emitter->buf->base + ech_size_offset, encoded_ch_inner.base + PTLS_HANDSHAKE_HEADER_SIZE,
                          encoded_ch_inner.off - PTLS_HANDSHAKE_HEADER_SIZE, is_second_flight,
                          emitter->buf->base + mess_start + PTLS_HANDSHAKE_HEADER_SIZE,
                          emitter->buf->off - (mess_start + PTLS_HANDSHAKE_HEADER_SIZE));
        /* keep the copy of the 1st ECH extension so that we can send it again in 2nd CH in response to rejection with HRR */
        if (!is_second_flight) {
            size_t len = outer_ech_header_size(tls->ech.client.enc.len) + ech_payload_size;
            if ((tls->ech.client.first_ech.base = malloc(len)) == NULL) {
                ret = PTLS_ERROR_NO_MEMORY;
                goto Exit;
            }
            memcpy(tls->ech.client.first_ech.base,
                   emitter->buf->base + ech_size_offset - outer_ech_header_size(tls->ech.client.enc.len), len);
            tls->ech.client.first_ech.len = len;
            if (properties->client.ech.configs.len != 0) {
                tls->ech.offered = 1;
            } else {
                tls->ech.offered_grease = 1;
            }
        }
        /* update hash */
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + mess_start, emitter->buf->off - mess_start, 1);
    }

    /* commit CH to the record layer */
    if ((ret = emitter->commit_message(emitter)) != 0)
        goto Exit;

    if (tls->client.using_early_data) {
        assert(!is_second_flight);
        if ((ret = setup_traffic_protection(tls, 1, "c e traffic", 1, 0, 0)) != 0)
            goto Exit;
        if ((ret = push_change_cipher_spec(tls, emitter)) != 0)
            goto Exit;
    }
    if (psk.secret.base != NULL && !is_second_flight) {
        if ((ret = derive_exporter_secret(tls, 1)) != 0)
            goto Exit;
    }
    tls->state = cookie == NULL ? PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO : PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    ptls_buffer_dispose(&encoded_ch_inner);
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}